

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_search.h
# Opt level: O3

int tx_size_cost(MACROBLOCK *x,BLOCK_SIZE bsize,TX_SIZE tx_size)

{
  _Bool _Var1;
  _Bool _Var2;
  MB_MODE_INFO *pMVar3;
  int iVar4;
  long lVar5;
  undefined7 in_register_00000031;
  byte bVar6;
  byte bVar7;
  
  iVar4 = 0;
  if (((int)CONCAT71(in_register_00000031,bsize) != 0) &&
     (iVar4 = 0, (x->txfm_search_params).tx_mode_search_type == '\x02')) {
    lVar5 = 0;
    for (bVar6 = ""[bsize]; bVar6 != tx_size; bVar6 = ""[bVar6]) {
      lVar5 = lVar5 + 1;
    }
    _Var1 = (x->e_mbd).up_available;
    _Var2 = (x->e_mbd).left_available;
    bVar6 = *(x->e_mbd).above_txfm_context;
    if ((_Var1 == true) &&
       ((pMVar3 = (x->e_mbd).above_mbmi, (pMVar3->field_0xa7 & 0x80) != 0 ||
        ('\0' < pMVar3->ref_frame[0])))) {
      bVar6 = block_size_wide[pMVar3->bsize];
    }
    bVar7 = *(x->e_mbd).left_txfm_context;
    if ((_Var2 != false) &&
       ((pMVar3 = (x->e_mbd).left_mbmi, (pMVar3->field_0xa7 & 0x80) != 0 ||
        ('\0' < pMVar3->ref_frame[0])))) {
      bVar7 = block_size_high[pMVar3->bsize];
    }
    iVar4 = *(int *)((long)(x->mode_costs).skip_txfm_cost +
                    lVar5 * 4 +
                    (ulong)(byte)(_Var1 & tx_size_wide[""[(*(x->e_mbd).mi)->bsize]] <=
                                          (int)(uint)bVar6) * 0x14 +
                    (ulong)(byte)(_Var2 & tx_size_high[""[(*(x->e_mbd).mi)->bsize]] <=
                                          (int)(uint)bVar7) * 0x14 +
                    (ulong)(byte)bsize_to_tx_size_cat_bsize_to_tx_size_depth_table[bsize] * 0x3c +
                    -0x24);
  }
  return iVar4;
}

Assistant:

static inline int tx_size_cost(const MACROBLOCK *const x, BLOCK_SIZE bsize,
                               TX_SIZE tx_size) {
  assert(bsize == x->e_mbd.mi[0]->bsize);
  if (x->txfm_search_params.tx_mode_search_type != TX_MODE_SELECT ||
      !block_signals_txsize(bsize))
    return 0;

  const int32_t tx_size_cat = bsize_to_tx_size_cat(bsize);
  const int depth = tx_size_to_depth(tx_size, bsize);
  const MACROBLOCKD *const xd = &x->e_mbd;
  const int tx_size_ctx = get_tx_size_context(xd);
  return x->mode_costs.tx_size_cost[tx_size_cat][tx_size_ctx][depth];
}